

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O3

void stressTest(void)

{
  initializer_list<double> __l;
  double local_98 [5];
  undefined1 local_70 [8];
  vector<double,_std::allocator<double>_> input;
  NeuralNet nn;
  vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> layerDefs;
  allocator_type local_11;
  
  nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98[0]._0_4_ = 0x32;
  input.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 4;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)
             &nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)local_98,
             (activationType *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_98[0]._0_4_ = 0x32;
  input.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 4;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)
             &nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)local_98,
             (activationType *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_98[0]._0_4_ = 0x32;
  input.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 4;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)
             &nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)local_98,
             (activationType *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_98[0] = (double)CONCAT44(local_98[0]._4_4_,2);
  input.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 4;
  std::vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>>::
  emplace_back<int,PyreNet::LayerDefinition::activationType>
            ((vector<PyreNet::LayerDefinition,std::allocator<PyreNet::LayerDefinition>> *)
             &nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(int *)local_98,
             (activationType *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  PyreNet::NeuralNet::NeuralNet
            ((NeuralNet *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,5,
             (vector<PyreNet::LayerDefinition,_std::allocator<PyreNet::LayerDefinition>_> *)
             &nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  PyreNet::NeuralNet::mutate_uniform
            ((NeuralNet *)
             &input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0.0,0.1,-1);
  local_98[2] = 2.0;
  local_98[3] = 3.0;
  local_98[0] = 0.0;
  local_98[1] = 1.0;
  local_98[4] = 4.0;
  __l._M_len = 5;
  __l._M_array = local_98;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_70,__l,&local_11);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Stress test complete",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  if (local_70 != (undefined1  [8])0x0) {
    operator_delete((void *)local_70,
                    (long)input.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_70);
  }
  std::vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>::~vector
            ((vector<PyreNet::Layer,_std::allocator<PyreNet::Layer>_> *)&nn);
  if (nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(nn.layers.super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    -(long)nn.layers.
                           super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void stressTest() {
    std::vector<PyreNet::LayerDefinition> layerDefs;
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(50, PyreNet::LayerDefinition::activationType::relu);
    layerDefs.emplace_back(2, PyreNet::LayerDefinition::activationType::relu);
    PyreNet::NeuralNet nn(5, layerDefs);
    nn.mutate_uniform(0, 0.1);
    std::vector<double> input{0,1,2,3,4};
    std::cout << "Stress test complete" << std::endl;
}